

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

Bigint * sd2b(U *d,int scale,int *e)

{
  byte bVar1;
  Bigint *pBVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  pBVar2 = (Bigint *)
           __ckd_malloc__(0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/dtoa.c"
                          ,0x1a9);
  if (pBVar2 == (Bigint *)0x0) {
    pBVar2 = (Bigint *)0x0;
  }
  else {
    pBVar2->k = 1;
    pBVar2->maxwds = 2;
    pBVar2->sign = 0;
    pBVar2->wds = 0;
  }
  if (pBVar2 == (Bigint *)0x0) {
    pBVar2 = (Bigint *)0x0;
  }
  else {
    pBVar2->wds = 2;
    pBVar2->x[0] = d->L[0];
    *(uint32 *)&pBVar2->field_0x1c = d->L[1] & 0xfffff;
    uVar3 = d->L[1] >> 0x14 & 0x7ff;
    *e = uVar3 - 0x433;
    if (uVar3 == 0) {
      *e = -0x432;
    }
    else {
      pBVar2->field_0x1e = pBVar2->field_0x1e | 0x10;
    }
    if ((scale != 0) && ((pBVar2->x[0] != 0 || (*(int *)&pBVar2->field_0x1c != 0)))) {
      iVar4 = *e - scale;
      *e = iVar4;
      if (iVar4 < -0x432) {
        *e = -0x432;
        if (iVar4 < -0x466) {
          __assert_fail("0 < scale && scale <= P - 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/dtoa.c"
                        ,0x452,"Bigint *sd2b(U *, int, int *)");
        }
        iVar5 = -0x432;
        if (iVar4 < -0x451) {
          if (pBVar2->x[0] != 0) {
            __assert_fail("b->x[0] == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/dtoa.c"
                          ,0x455,"Bigint *sd2b(U *, int, int *)");
          }
          pBVar2->x[0] = *(uint32 *)&pBVar2->field_0x1c;
          *(undefined4 *)&pBVar2->field_0x1c = 0;
          iVar5 = -0x452;
        }
        if (iVar5 - iVar4 != 0) {
          bVar1 = (byte)(iVar5 - iVar4);
          if (pBVar2->x[0] << (-bVar1 & 0x1f) != 0) {
            __assert_fail("b->x[0] << (32 - scale) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/dtoa.c"
                          ,0x45c,"Bigint *sd2b(U *, int, int *)");
          }
          pBVar2->x[0] = *(uint *)&pBVar2->field_0x1c << (0x20 - bVar1 & 0x1f) |
                         pBVar2->x[0] >> (bVar1 & 0x1f);
          *(uint *)&pBVar2->field_0x1c = *(uint *)&pBVar2->field_0x1c >> (bVar1 & 0x1f);
        }
      }
    }
    if (*(int *)&pBVar2->field_0x1c == 0) {
      pBVar2->wds = 1;
    }
  }
  return pBVar2;
}

Assistant:

static Bigint *
sd2b(U *d, int scale, int *e)
{
    Bigint *b;

    b = Balloc(1);
    if (b == NULL)
        return NULL;
    
    /* First construct b and e assuming that scale == 0. */
    b->wds = 2;
    b->x[0] = word1(d);
    b->x[1] = word0(d) & Frac_mask;
    *e = Etiny - 1 + (int)((word0(d) & Exp_mask) >> Exp_shift);
    if (*e < Etiny)
        *e = Etiny;
    else
        b->x[1] |= Exp_msk1;

    /* Now adjust for scale, provided that b != 0. */
    if (scale && (b->x[0] || b->x[1])) {
        *e -= scale;
        if (*e < Etiny) {
            scale = Etiny - *e;
            *e = Etiny;
            /* We can't shift more than P-1 bits without shifting out a 1. */
            assert(0 < scale && scale <= P - 1);
            if (scale >= 32) {
                /* The bits shifted out should all be zero. */
                assert(b->x[0] == 0);
                b->x[0] = b->x[1];
                b->x[1] = 0;
                scale -= 32;
            }
            if (scale) {
                /* The bits shifted out should all be zero. */
                assert(b->x[0] << (32 - scale) == 0);
                b->x[0] = (b->x[0] >> scale) | (b->x[1] << (32 - scale));
                b->x[1] >>= scale;
            }
        }
    }
    /* Ensure b is normalized. */
    if (!b->x[1])
        b->wds = 1;

    return b;
}